

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O0

void __thiscall
Assimp::MDLImporter::GenerateOutputMeshes_3DGS_MDL7
          (MDLImporter *this,IntGroupData_MDL7 *groupData,IntSplitGroupData_MDL7 *splitGroupData)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  float fVar15;
  bool bVar16;
  aiMesh *paVar17;
  aiMesh *paVar18;
  size_type sVar19;
  ulong uVar20;
  ulong uVar21;
  ulong *puVar22;
  aiVector3D *paVar23;
  uint *puVar24;
  reference pvVar25;
  reference pvVar26;
  reference pvVar27;
  Logger *this_00;
  reference this_01;
  aiBone **ppaVar28;
  reference pvVar29;
  aiBone *this_02;
  aiVertexWeight *paVar30;
  const_reference pvVar31;
  aiFace *paVar32;
  ulong uVar33;
  aiVertexWeight *local_600;
  aiVector3t<float> *local_5b8;
  aiVector3t<float> *local_590;
  aiVector3t<float> *local_568;
  aiVector3t<float> *local_540;
  aiFace *local_518;
  uint local_4f0;
  undefined1 local_4ec [4];
  uint weight;
  aiBone *local_e8;
  aiBone *pcBone;
  __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  local_d8;
  __normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  local_d0;
  const_iterator k_1;
  __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  local_c0;
  __normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  local_b8;
  const_iterator k;
  uint local_a8;
  uint local_a4;
  uint iBone;
  uint c_1;
  IntFace_MDL7 *oldFace_1;
  uint iSrcFace_1;
  uint iFace_1;
  int iCurrent_1;
  undefined1 local_80 [8];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  aaiVWeightList;
  uint32_t iIndex;
  uint c;
  IntFace_MDL7 *oldFace;
  uint local_50;
  uint iSrcFace;
  uint iFace;
  uint iCurrent;
  aiMesh *pcMesh;
  size_type i;
  uchar *puStack_30;
  uint iNumOutBones;
  Header_MDL7 *pcHeader;
  IntSharedData_MDL7 *shared;
  IntSplitGroupData_MDL7 *splitGroupData_local;
  IntGroupData_MDL7 *groupData_local;
  MDLImporter *this_local;
  
  pcHeader = (Header_MDL7 *)splitGroupData->shared;
  puStack_30 = this->mBuffer;
  i._4_4_ = *(uint *)(puStack_30 + 8);
  shared = (IntSharedData_MDL7 *)splitGroupData;
  splitGroupData_local = (IntSplitGroupData_MDL7 *)groupData;
  groupData_local = (IntGroupData_MDL7 *)this;
  for (pcMesh = (aiMesh *)0x0; paVar18 = pcMesh,
      paVar17 = (aiMesh *)
                std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size
                          ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)
                           &pcHeader->mainvertex_stc_size), paVar18 < paVar17;
      pcMesh = (aiMesh *)((long)&pcMesh->mPrimitiveTypes + 1)) {
    bVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                       (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                         ((long)(shared->abNeedMaterials).super__Bvector_base<std::allocator<bool>_>
                                ._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                _M_p + (long)pcMesh * 8));
    if (!bVar16) {
      paVar18 = (aiMesh *)operator_new(0x520);
      aiMesh::aiMesh(paVar18);
      paVar18->mPrimitiveTypes = 4;
      paVar18->mMaterialIndex = (uint)pcMesh;
      _iFace = paVar18;
      sVar19 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                         (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                           ((long)(shared->abNeedMaterials).
                                  super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           (long)pcMesh * 8));
      _iFace->mNumFaces = (uint)sVar19;
      uVar20 = CONCAT44(0,_iFace->mNumFaces);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar20;
      uVar21 = SUB168(auVar2 * ZEXT816(0x10),0);
      uVar33 = uVar21 + 8;
      if (SUB168(auVar2 * ZEXT816(0x10),8) != 0 || 0xfffffffffffffff7 < uVar21) {
        uVar33 = 0xffffffffffffffff;
      }
      puVar22 = (ulong *)operator_new__(uVar33);
      *puVar22 = uVar20;
      paVar32 = (aiFace *)(puVar22 + 1);
      if (uVar20 != 0) {
        local_518 = paVar32;
        do {
          aiFace::aiFace(local_518);
          local_518 = local_518 + 1;
        } while (local_518 != paVar32 + uVar20);
      }
      _iFace->mFaces = paVar32;
      _iFace->mNumVertices = _iFace->mNumFaces * 3;
      uVar20 = CONCAT44(0,_iFace->mNumVertices);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar20;
      uVar21 = SUB168(auVar3 * ZEXT816(0xc),0);
      if (SUB168(auVar3 * ZEXT816(0xc),8) != 0) {
        uVar21 = 0xffffffffffffffff;
      }
      paVar23 = (aiVector3D *)operator_new__(uVar21);
      if (uVar20 != 0) {
        local_540 = paVar23;
        do {
          aiVector3t<float>::aiVector3t(local_540);
          local_540 = local_540 + 1;
        } while (local_540 != paVar23 + uVar20);
      }
      _iFace->mVertices = paVar23;
      uVar20 = CONCAT44(0,_iFace->mNumVertices);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar20;
      uVar21 = SUB168(auVar4 * ZEXT816(0xc),0);
      if (SUB168(auVar4 * ZEXT816(0xc),8) != 0) {
        uVar21 = 0xffffffffffffffff;
      }
      paVar23 = (aiVector3D *)operator_new__(uVar21);
      if (uVar20 != 0) {
        local_568 = paVar23;
        do {
          aiVector3t<float>::aiVector3t(local_568);
          local_568 = local_568 + 1;
        } while (local_568 != paVar23 + uVar20);
      }
      _iFace->mNormals = paVar23;
      bVar16 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::empty
                         ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                          (splitGroupData_local + 4));
      if (!bVar16) {
        _iFace->mNumUVComponents[0] = 2;
        uVar20 = CONCAT44(0,_iFace->mNumVertices);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar20;
        uVar21 = SUB168(auVar5 * ZEXT816(0xc),0);
        if (SUB168(auVar5 * ZEXT816(0xc),8) != 0) {
          uVar21 = 0xffffffffffffffff;
        }
        paVar23 = (aiVector3D *)operator_new__(uVar21);
        if (uVar20 != 0) {
          local_590 = paVar23;
          do {
            aiVector3t<float>::aiVector3t(local_590);
            local_590 = local_590 + 1;
          } while (local_590 != paVar23 + uVar20);
        }
        _iFace->mTextureCoords[0] = paVar23;
        bVar16 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::empty
                           ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                            (splitGroupData_local + 5));
        if (!bVar16) {
          _iFace->mNumUVComponents[1] = 2;
          uVar20 = CONCAT44(0,_iFace->mNumVertices);
          auVar6._8_8_ = 0;
          auVar6._0_8_ = uVar20;
          uVar21 = SUB168(auVar6 * ZEXT816(0xc),0);
          if (SUB168(auVar6 * ZEXT816(0xc),8) != 0) {
            uVar21 = 0xffffffffffffffff;
          }
          paVar23 = (aiVector3D *)operator_new__(uVar21);
          if (uVar20 != 0) {
            local_5b8 = paVar23;
            do {
              aiVector3t<float>::aiVector3t(local_5b8);
              local_5b8 = local_5b8 + 1;
            } while (local_5b8 != paVar23 + uVar20);
          }
          _iFace->mTextureCoords[1] = paVar23;
        }
      }
      iSrcFace = 0;
      for (local_50 = 0; local_50 < _iFace->mNumFaces; local_50 = local_50 + 1) {
        _iFace->mFaces[local_50].mNumIndices = 3;
        puVar24 = (uint *)operator_new__(0xc);
        _iFace->mFaces[local_50].mIndices = puVar24;
        pvVar25 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                              ((long)(shared->abNeedMaterials).
                                     super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                              + (long)pcMesh * 8),(ulong)local_50);
        pvVar26 = std::vector<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>
                  ::operator[]((vector<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>
                                *)splitGroupData_local,(ulong)*pvVar25);
        for (aaiVWeightList.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
            aaiVWeightList.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 3;
            aaiVWeightList.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                 aaiVWeightList.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
          aaiVWeightList.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
               pvVar26->mIndices
               [aaiVWeightList.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_];
          pvVar27 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                               (splitGroupData_local + 1),
                               (ulong)(uint)aaiVWeightList.
                                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
          paVar23 = _iFace->mVertices + iSrcFace;
          fVar15 = pvVar27->y;
          paVar23->x = pvVar27->x;
          paVar23->y = fVar15;
          paVar23->z = pvVar27->z;
          pvVar27 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                               (splitGroupData_local + 2),
                               (ulong)(uint)aaiVWeightList.
                                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
          paVar23 = _iFace->mNormals + iSrcFace;
          fVar15 = pvVar27->y;
          paVar23->x = pvVar27->x;
          paVar23->y = fVar15;
          paVar23->z = pvVar27->z;
          bVar16 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::empty
                             ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                              (splitGroupData_local + 4));
          if (!bVar16) {
            pvVar27 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::
                      operator[]((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                                 (splitGroupData_local + 4),
                                 (ulong)(uint)aaiVWeightList.
                                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
            paVar23 = _iFace->mTextureCoords[0] + iSrcFace;
            fVar15 = pvVar27->y;
            paVar23->x = pvVar27->x;
            paVar23->y = fVar15;
            paVar23->z = pvVar27->z;
            bVar16 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::empty
                               ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                                (splitGroupData_local + 5));
            if (!bVar16) {
              pvVar27 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::
                        operator[]((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *
                                   )(splitGroupData_local + 5),
                                   (ulong)(uint)aaiVWeightList.
                                                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
              paVar23 = _iFace->mTextureCoords[1] + iSrcFace;
              fVar15 = pvVar27->y;
              paVar23->x = pvVar27->x;
              paVar23->y = fVar15;
              paVar23->z = pvVar27->z;
            }
          }
          _iFace->mFaces[local_50].mIndices
          [aaiVWeightList.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_] = iSrcFace;
          iSrcFace = iSrcFace + 1;
        }
      }
      bVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          (splitGroupData_local + 3));
      if (!bVar16) {
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)local_80);
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::resize((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)local_80,(ulong)i._4_4_);
        iSrcFace_1 = 0;
        for (oldFace_1._4_4_ = 0; oldFace_1._4_4_ < _iFace->mNumFaces;
            oldFace_1._4_4_ = oldFace_1._4_4_ + 1) {
          pvVar25 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                                ((long)(shared->abNeedMaterials).
                                       super__Bvector_base<std::allocator<bool>_>._M_impl.
                                       super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                       _M_p + (long)pcMesh * 8),(ulong)oldFace_1._4_4_);
          pvVar26 = std::
                    vector<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>::
                    operator[]((vector<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>
                                *)splitGroupData_local,(ulong)*pvVar25);
          for (local_a4 = 0; local_a4 < 3; local_a4 = local_a4 + 1) {
            pvVar25 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 (splitGroupData_local + 3),(ulong)pvVar26->mIndices[local_a4]);
            local_a8 = *pvVar25;
            if (local_a8 != 0xffffffff) {
              if (i._4_4_ <= local_a8) {
                this_00 = DefaultLogger::get();
                Logger::error(this_00,
                              "Bone index overflow. The bone index of a vertex exceeds the allowed range. "
                             );
                local_a8 = i._4_4_ - 1;
              }
              this_01 = std::
                        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                      *)local_80,(ulong)local_a8);
              k._M_current._4_4_ = iSrcFace_1;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        (this_01,(value_type_conflict3 *)((long)&k._M_current + 4));
            }
            iSrcFace_1 = iSrcFace_1 + 1;
          }
        }
        local_c0._M_current =
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::begin((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      *)local_80);
        __gnu_cxx::
        __normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
        ::__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>*>
                  ((__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
                    *)&local_b8,&local_c0);
        while( true ) {
          k_1._M_current =
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::end((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      *)local_80);
          bVar16 = __gnu_cxx::operator!=
                             (&local_b8,
                              (__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                               *)&k_1);
          if (!bVar16) break;
          pvVar29 = __gnu_cxx::
                    __normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                    ::operator*(&local_b8);
          bVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(pvVar29);
          if (!bVar16) {
            _iFace->mNumBones = _iFace->mNumBones + 1;
          }
          __gnu_cxx::
          __normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
          ::operator++(&local_b8);
        }
        ppaVar28 = (aiBone **)operator_new__((ulong)_iFace->mNumBones << 3);
        _iFace->mBones = ppaVar28;
        iSrcFace_1 = 0;
        local_d8._M_current =
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::begin((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      *)local_80);
        __gnu_cxx::
        __normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
        ::__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>*>
                  ((__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
                    *)&local_d0,&local_d8);
        while( true ) {
          pcBone = (aiBone *)
                   std::
                   vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ::end((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          *)local_80);
          bVar16 = __gnu_cxx::operator!=
                             (&local_d0,
                              (__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                               *)&pcBone);
          if (!bVar16) break;
          pvVar29 = __gnu_cxx::
                    __normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                    ::operator*(&local_d0);
          bVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(pvVar29);
          if (!bVar16) {
            this_02 = (aiBone *)operator_new(0x450);
            aiBone::aiBone(this_02);
            _iFace->mBones[(int)iSrcFace_1] = this_02;
            local_e8 = this_02;
            aiString::aiString((aiString *)local_4ec,
                               *(aiString **)
                                (*(long *)&pcHeader[1].data_size + (long)(int)iSrcFace_1 * 8));
            aiString::operator=(&local_e8->mName,(aiString *)local_4ec);
            lVar1 = *(long *)(*(long *)&pcHeader[1].data_size + (long)(int)iSrcFace_1 * 8);
            uVar7 = *(undefined8 *)(lVar1 + 0x410);
            uVar8 = *(undefined8 *)(lVar1 + 0x418);
            uVar9 = *(undefined8 *)(lVar1 + 0x420);
            uVar10 = *(undefined8 *)(lVar1 + 0x428);
            uVar11 = *(undefined8 *)(lVar1 + 0x430);
            uVar12 = *(undefined8 *)(lVar1 + 0x438);
            uVar13 = *(undefined8 *)(lVar1 + 0x440);
            uVar14 = *(undefined8 *)(lVar1 + 0x448);
            (local_e8->mOffsetMatrix).d1 = (float)(int)uVar13;
            (local_e8->mOffsetMatrix).d2 = (float)(int)((ulong)uVar13 >> 0x20);
            (local_e8->mOffsetMatrix).d3 = (float)(int)uVar14;
            (local_e8->mOffsetMatrix).d4 = (float)(int)((ulong)uVar14 >> 0x20);
            (local_e8->mOffsetMatrix).c1 = (float)(int)uVar11;
            (local_e8->mOffsetMatrix).c2 = (float)(int)((ulong)uVar11 >> 0x20);
            (local_e8->mOffsetMatrix).c3 = (float)(int)uVar12;
            (local_e8->mOffsetMatrix).c4 = (float)(int)((ulong)uVar12 >> 0x20);
            (local_e8->mOffsetMatrix).b1 = (float)(int)uVar9;
            (local_e8->mOffsetMatrix).b2 = (float)(int)((ulong)uVar9 >> 0x20);
            (local_e8->mOffsetMatrix).b3 = (float)(int)uVar10;
            (local_e8->mOffsetMatrix).b4 = (float)(int)((ulong)uVar10 >> 0x20);
            (local_e8->mOffsetMatrix).a1 = (float)(int)uVar7;
            (local_e8->mOffsetMatrix).a2 = (float)(int)((ulong)uVar7 >> 0x20);
            (local_e8->mOffsetMatrix).a3 = (float)(int)uVar8;
            (local_e8->mOffsetMatrix).a4 = (float)(int)((ulong)uVar8 >> 0x20);
            pvVar29 = __gnu_cxx::
                      __normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                      ::operator*(&local_d0);
            sVar19 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar29);
            local_e8->mNumWeights = (uint)sVar19;
            uVar20 = (ulong)local_e8->mNumWeights;
            paVar30 = (aiVertexWeight *)operator_new__(uVar20 << 3);
            if (uVar20 != 0) {
              local_600 = paVar30;
              do {
                aiVertexWeight::aiVertexWeight(local_600);
                local_600 = local_600 + 1;
              } while (local_600 != paVar30 + uVar20);
            }
            local_e8->mWeights = paVar30;
            for (local_4f0 = 0; local_4f0 < local_e8->mNumWeights; local_4f0 = local_4f0 + 1) {
              pvVar29 = __gnu_cxx::
                        __normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                        ::operator*(&local_d0);
              pvVar31 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  (pvVar29,(ulong)local_4f0);
              local_e8->mWeights[local_4f0].mVertexId = *pvVar31;
              local_e8->mWeights[local_4f0].mWeight = 1.0;
            }
          }
          __gnu_cxx::
          __normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
          ::operator++(&local_d0);
          iSrcFace_1 = iSrcFace_1 + 1;
        }
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   *)local_80);
      }
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                 (shared->abNeedMaterials).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p,
                 (value_type *)&iFace);
    }
  }
  return;
}

Assistant:

void MDLImporter::GenerateOutputMeshes_3DGS_MDL7(
    MDL::IntGroupData_MDL7& groupData,
    MDL::IntSplitGroupData_MDL7& splitGroupData)
{
    const MDL::IntSharedData_MDL7& shared = splitGroupData.shared;

    // get a pointer to the header ...
    const MDL::Header_MDL7* const pcHeader = (const MDL::Header_MDL7*)this->mBuffer;
    const unsigned int iNumOutBones = pcHeader->bones_num;

    for (std::vector<aiMaterial*>::size_type i = 0; i < shared.pcMats.size();++i)   {
        if (!splitGroupData.aiSplit[i]->empty())    {

            // allocate the output mesh
            aiMesh* pcMesh = new aiMesh();

            pcMesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;
            pcMesh->mMaterialIndex = (unsigned int)i;

            // allocate output storage
            pcMesh->mNumFaces = (unsigned int)splitGroupData.aiSplit[i]->size();
            pcMesh->mFaces = new aiFace[pcMesh->mNumFaces];

            pcMesh->mNumVertices = pcMesh->mNumFaces*3;
            pcMesh->mVertices = new aiVector3D[pcMesh->mNumVertices];
            pcMesh->mNormals = new aiVector3D[pcMesh->mNumVertices];

            if (!groupData.vTextureCoords1.empty()) {
                pcMesh->mNumUVComponents[0] = 2;
                pcMesh->mTextureCoords[0] = new aiVector3D[pcMesh->mNumVertices];
                if (!groupData.vTextureCoords2.empty()) {
                    pcMesh->mNumUVComponents[1] = 2;
                    pcMesh->mTextureCoords[1] = new aiVector3D[pcMesh->mNumVertices];
                }
            }

            // iterate through all faces and build an unique set of vertices
            unsigned int iCurrent = 0;
            for (unsigned int iFace = 0; iFace < pcMesh->mNumFaces;++iFace) {
                pcMesh->mFaces[iFace].mNumIndices = 3;
                pcMesh->mFaces[iFace].mIndices = new unsigned int[3];

                unsigned int iSrcFace = splitGroupData.aiSplit[i]->operator[](iFace);
                const MDL::IntFace_MDL7& oldFace = groupData.pcFaces[iSrcFace];

                // iterate through all face indices
                for (unsigned int c = 0; c < 3;++c) {
                    const uint32_t iIndex = oldFace.mIndices[c];
                    pcMesh->mVertices[iCurrent] = groupData.vPositions[iIndex];
                    pcMesh->mNormals[iCurrent] = groupData.vNormals[iIndex];

                    if (!groupData.vTextureCoords1.empty()) {

                        pcMesh->mTextureCoords[0][iCurrent] = groupData.vTextureCoords1[iIndex];
                        if (!groupData.vTextureCoords2.empty()) {
                            pcMesh->mTextureCoords[1][iCurrent] = groupData.vTextureCoords2[iIndex];
                        }
                    }
                    pcMesh->mFaces[iFace].mIndices[c] = iCurrent++;
                }
            }

            // if we have bones in the mesh we'll need to generate
            // proper vertex weights for them
            if (!groupData.aiBones.empty()) {
                std::vector<std::vector<unsigned int> > aaiVWeightList;
                aaiVWeightList.resize(iNumOutBones);

                int iCurrent = 0;
                for (unsigned int iFace = 0; iFace < pcMesh->mNumFaces;++iFace) {
                    unsigned int iSrcFace = splitGroupData.aiSplit[i]->operator[](iFace);
                    const MDL::IntFace_MDL7& oldFace = groupData.pcFaces[iSrcFace];

                    // iterate through all face indices
                    for (unsigned int c = 0; c < 3;++c) {
                        unsigned int iBone = groupData.aiBones[ oldFace.mIndices[c] ];
                        if (UINT_MAX != iBone)  {
                            if (iBone >= iNumOutBones)  {
                                ASSIMP_LOG_ERROR("Bone index overflow. "
                                    "The bone index of a vertex exceeds the allowed range. ");
                                iBone = iNumOutBones-1;
                            }
                            aaiVWeightList[ iBone ].push_back ( iCurrent );
                        }
                        ++iCurrent;
                    }
                }
                // now check which bones are required ...
                for (std::vector<std::vector<unsigned int> >::const_iterator k =  aaiVWeightList.begin();k != aaiVWeightList.end();++k) {
                    if (!(*k).empty()) {
                        ++pcMesh->mNumBones;
                    }
                }
                pcMesh->mBones = new aiBone*[pcMesh->mNumBones];
                iCurrent = 0;
                for (std::vector<std::vector<unsigned int> >::const_iterator k = aaiVWeightList.begin();k!= aaiVWeightList.end();++k,++iCurrent)
                {
                    if ((*k).empty())
                        continue;

                    // seems we'll need this node
                    aiBone* pcBone = pcMesh->mBones[ iCurrent ] = new aiBone();
                    pcBone->mName = aiString(shared.apcOutBones[ iCurrent ]->mName);
                    pcBone->mOffsetMatrix = shared.apcOutBones[ iCurrent ]->mOffsetMatrix;

                    // setup vertex weights
                    pcBone->mNumWeights = (unsigned int)(*k).size();
                    pcBone->mWeights = new aiVertexWeight[pcBone->mNumWeights];

                    for (unsigned int weight = 0; weight < pcBone->mNumWeights;++weight)    {
                        pcBone->mWeights[weight].mVertexId = (*k)[weight];
                        pcBone->mWeights[weight].mWeight = 1.0f;
                    }
                }
            }
            // add the mesh to the list of output meshes
            splitGroupData.avOutList.push_back(pcMesh);
        }
    }
}